

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O0

void __thiscall sc_core::sc_module::sc_module(sc_module *this,string *s)

{
  sc_module *in_RDI;
  int in_stack_00000034;
  char *in_stack_00000048;
  sc_severity in_stack_00000054;
  char *in_stack_00000068;
  sc_object *in_stack_00000070;
  sc_module *this_00;
  
  std::__cxx11::string::c_str();
  sc_object::sc_object(in_stack_00000070,in_stack_00000068);
  sc_process_host::sc_process_host(&in_RDI->super_sc_process_host);
  (in_RDI->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00364d78;
  (in_RDI->super_sc_process_host)._vptr_sc_process_host = (_func_int **)&DAT_00364e20;
  this_00 = (sc_module *)&in_RDI->sensitive;
  sc_sensitive::sc_sensitive((sc_sensitive *)this_00,in_RDI);
  sc_sensitive_pos::sc_sensitive_pos(&in_RDI->sensitive_pos,in_RDI);
  sc_sensitive_neg::sc_sensitive_neg(&in_RDI->sensitive_neg,in_RDI);
  in_RDI->m_end_module_called = false;
  in_RDI->m_port_vec =
       (vector<sc_core::sc_port_base_*,_std::allocator<sc_core::sc_port_base_*>_> *)0x0;
  in_RDI->m_port_index = 0;
  in_RDI->m_name_gen = (sc_name_gen *)0x0;
  in_RDI->m_module_name_p = (sc_module_name *)0x0;
  std::__cxx11::string::c_str();
  sc_report_handler::report
            (in_stack_00000054,in_stack_00000048,(char *)this,(char *)s,in_stack_00000034);
  sc_module_init(this_00);
  return;
}

Assistant:

sc_module::sc_module( const std::string& s )
: sc_object( s.c_str() ),
  sensitive(this),
  sensitive_pos(this),
  sensitive_neg(this),
  m_end_module_called(false),
  m_port_vec(),
  m_port_index(0),
  m_name_gen(0),
  m_module_name_p(0)
{
    SC_REPORT_WARNING( SC_ID_BAD_SC_MODULE_CONSTRUCTOR_, s.c_str() );
    sc_module_init();
}